

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O2

bool __thiscall
DIS::ArealObjectStatePdu::operator==(ArealObjectStatePdu *this,ArealObjectStatePdu *rhs)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  pointer pVVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  size_t idx;
  ulong uVar15;
  long lVar16;
  
  bVar8 = SyntheticEnvironmentFamilyPdu::operator==
                    (&this->super_SyntheticEnvironmentFamilyPdu,
                     &rhs->super_SyntheticEnvironmentFamilyPdu);
  bVar9 = EntityID::operator==(&this->_objectID,&rhs->_objectID);
  bVar10 = EntityID::operator==(&this->_referencedObjectID,&rhs->_referencedObjectID);
  uVar5 = this->_updateNumber;
  uVar6 = rhs->_updateNumber;
  uVar1 = rhs->_forceID;
  uVar2 = this->_forceID;
  uVar3 = rhs->_modifications;
  uVar4 = this->_modifications;
  bVar11 = EntityType::operator==(&this->_objectType,&rhs->_objectType);
  bVar12 = SixByteChunk::operator==(&this->_objectAppearance,&rhs->_objectAppearance);
  bVar13 = SimulationAddress::operator==(&this->_requesterID,&rhs->_requesterID);
  bVar14 = SimulationAddress::operator==(&this->_receivingID,&rhs->_receivingID);
  bVar8 = (uVar2 == uVar1 && (uVar5 == uVar6 && (bVar10 && (bVar9 && bVar8)))) &&
          (((bVar14 && bVar13) && (bVar12 && bVar11)) && uVar4 == uVar3);
  lVar16 = 0;
  for (uVar15 = 0;
      pVVar7 = (this->_objectLocation).
               super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(this->_objectLocation).
                             super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7 >> 5);
      uVar15 = uVar15 + 1) {
    bVar9 = Vector3Double::operator==
                      ((Vector3Double *)((long)&pVVar7->_vptr_Vector3Double + lVar16),
                       (Vector3Double *)
                       ((long)&((rhs->_objectLocation).
                                super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_Vector3Double +
                       lVar16));
    bVar8 = (bool)(bVar8 & bVar9);
    lVar16 = lVar16 + 0x20;
  }
  return bVar8;
}

Assistant:

bool ArealObjectStatePdu::operator ==(const ArealObjectStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SyntheticEnvironmentFamilyPdu::operator==(rhs);

     if( ! (_objectID == rhs._objectID) ) ivarsEqual = false;
     if( ! (_referencedObjectID == rhs._referencedObjectID) ) ivarsEqual = false;
     if( ! (_updateNumber == rhs._updateNumber) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_modifications == rhs._modifications) ) ivarsEqual = false;
     if( ! (_objectType == rhs._objectType) ) ivarsEqual = false;
     if( ! (_objectAppearance == rhs._objectAppearance) ) ivarsEqual = false;
     if( ! (_requesterID == rhs._requesterID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _objectLocation.size(); idx++)
     {
        if( ! ( _objectLocation[idx] == rhs._objectLocation[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }